

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

void ma_spatializer_listener_get_cone
               (ma_spatializer_listener *pListener,float *pInnerAngleInRadians,
               float *pOuterAngleInRadians,float *pOuterGain)

{
  if (pListener != (ma_spatializer_listener *)0x0) {
    if (pInnerAngleInRadians != (float *)0x0) {
      *pInnerAngleInRadians = (pListener->config).coneInnerAngleInRadians;
    }
    if (pOuterAngleInRadians != (float *)0x0) {
      *pOuterAngleInRadians = (pListener->config).coneOuterAngleInRadians;
    }
    if (pOuterGain != (float *)0x0) {
      *pOuterGain = (pListener->config).coneOuterGain;
    }
  }
  return;
}

Assistant:

MA_API void ma_spatializer_listener_get_cone(const ma_spatializer_listener* pListener, float* pInnerAngleInRadians, float* pOuterAngleInRadians, float* pOuterGain)
{
    if (pListener == NULL) {
        return;
    }

    if (pInnerAngleInRadians != NULL) {
        *pInnerAngleInRadians = pListener->config.coneInnerAngleInRadians;
    }

    if (pOuterAngleInRadians != NULL) {
        *pOuterAngleInRadians = pListener->config.coneOuterAngleInRadians;
    }

    if (pOuterGain != NULL) {
        *pOuterGain = pListener->config.coneOuterGain;
    }
}